

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_108fc24::GetListString(string *listString,string *var,cmMakefile *makefile)

{
  cmValue cVar1;
  
  cVar1 = cmMakefile::GetDefinition(makefile,var);
  if (cVar1.Value != (string *)0x0) {
    std::__cxx11::string::_M_assign((string *)listString);
  }
  return cVar1.Value != (string *)0x0;
}

Assistant:

bool GetListString(std::string& listString, const std::string& var,
                   const cmMakefile& makefile)
{
  // get the old value
  cmValue cacheValue = makefile.GetDefinition(var);
  if (!cacheValue) {
    return false;
  }
  listString = *cacheValue;
  return true;
}